

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzeuleranalysis.cpp
# Opt level: O3

void __thiscall
TPZEulerAnalysis::SetGMResFront(TPZEulerAnalysis *this,REAL tol,int numiter,int numvectors)

{
  TPZBaseMatrix *pTVar1;
  TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_> strfront;
  TPZSpStructMatrix<double,_TPZStructMatrixOR<double>_> StrMatrix;
  TPZStepSolver<double> Solver;
  TPZStepSolver<double> FrontSolver;
  TPZAutoPointer<TPZBaseMatrix> local_410;
  TPZAutoPointer<TPZBaseMatrix> local_408;
  int local_400;
  int local_3fc;
  pointer_____offset_0x68___ *local_3f8;
  TPZAutoPointer<TPZMatrix<double>_> local_3f0;
  TPZAutoPointer<TPZMatrix<double>_> local_3e8;
  TPZAutoPointer<TPZGuiInterface> local_3e0;
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [168];
  undefined **local_320;
  void *local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined4 local_2f0;
  undefined1 local_2ec;
  undefined1 local_2e8 [168];
  undefined8 local_240;
  undefined4 local_238;
  undefined1 local_234;
  TPZStepSolver<double> local_230;
  TPZStepSolver<double> local_130;
  
  local_2f8 = 0x19254e8;
  local_3c8._0_8_ = 0x19255b0;
  local_2f0 = 0;
  local_2ec = 1;
  local_3f8 = &PTR_construction_vtable_104__01924e08;
  local_400 = numiter;
  local_3fc = numvectors;
  local_3d8._8_8_ = tol;
  TPZStructMatrix::TPZStructMatrix
            ((TPZStructMatrix *)local_3c8,&PTR_construction_vtable_104__01924e08,
             (this->super_TPZLinearAnalysis).super_TPZAnalysis.fCompMesh);
  local_2f8 = 0x1924fc0;
  local_3c8._0_8_ = 0x1924ee0;
  TPZStructMatrixOR<double>::TPZStructMatrixOR
            ((TPZStructMatrixOR<double> *)(local_3c8 + 0xa0),&PTR_construction_vtable_104__01924e30)
  ;
  local_2f8 = 0x1924d88;
  local_3c8._0_8_ = 0x1924bb0;
  local_3c8._160_8_ = 0x1924c88;
  local_320 = &PTR__TPZVec_01813ef0;
  local_318 = (void *)0x0;
  uStack_310 = 0;
  local_308 = 0;
  uStack_300._0_4_ = 0;
  uStack_300._4_4_ = ENoDecompose;
  TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_>::SetQuiet
            ((TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_> *)
             local_3c8,1);
  pTVar1 = TPZSolutionMatrix::operator_cast_to_TPZBaseMatrix_(&(this->super_TPZLinearAnalysis).fRhs)
  ;
  local_3e0.fRef = (TPZReference *)operator_new(0x10);
  ((local_3e0.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
  (local_3e0.fRef)->fPointer = (TPZGuiInterface *)0x0;
  LOCK();
  ((local_3e0.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  pTVar1 = &TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_>::
            CreateAssemble((TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_>
                            *)local_3c8,pTVar1,&local_3e0)->super_TPZBaseMatrix;
  TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer(&local_3e0);
  local_3e8.fRef = (TPZReference *)operator_new(0x10);
  ((local_3e8.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
  (local_3e8.fRef)->fPointer = (TPZMatrix<double> *)0x0;
  LOCK();
  ((local_3e8.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  TPZStepSolver<double>::TPZStepSolver(&local_130,&local_3e8);
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer(&local_3e8);
  TPZStepSolver<double>::SetDirect(&local_130,ELU);
  local_408.fRef = (TPZReference *)0x0;
  local_408.fRef = (TPZReference *)operator_new(0x10);
  local_3d8._0_8_ = 0x1924bb0;
  ((local_408.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
  (local_408.fRef)->fPointer = pTVar1;
  LOCK();
  ((local_408.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  TPZMatrixSolver<double>::SetMatrix(&local_130.super_TPZMatrixSolver<double>,&local_408);
  TPZAutoPointer<TPZBaseMatrix>::~TPZAutoPointer(&local_408);
  local_240 = 0x1923278;
  local_2e8._0_8_ = 0x1923340;
  local_238 = 0;
  local_234 = 1;
  TPZStructMatrix::TPZStructMatrix
            ((TPZStructMatrix *)local_2e8,&PTR_construction_vtable_104__01922b98,
             (this->super_TPZLinearAnalysis).super_TPZAnalysis.fCompMesh);
  local_240 = 0x1922d50;
  local_2e8._0_8_ = 0x1922c70;
  TPZStructMatrixOR<double>::TPZStructMatrixOR
            ((TPZStructMatrixOR<double> *)(local_2e8 + 0xa0),&PTR_construction_vtable_104__01922bc0)
  ;
  local_240 = 0x1922b18;
  local_2e8._0_8_ = 0x1922948;
  local_2e8._160_8_ = 0x1922a18;
  TPZAnalysis::SetStructuralMatrix((TPZAnalysis *)this,(TPZStructMatrix *)local_2e8);
  pTVar1 = &TPZSpStructMatrix<double,_TPZStructMatrixOR<double>_>::Create
                      ((TPZSpStructMatrix<double,_TPZStructMatrixOR<double>_> *)local_2e8)->
            super_TPZBaseMatrix;
  local_3f0.fRef = (TPZReference *)operator_new(0x10);
  ((local_3f0.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
  (local_3f0.fRef)->fPointer = (TPZMatrix<double> *)0x0;
  LOCK();
  ((local_3f0.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  TPZStepSolver<double>::TPZStepSolver(&local_230,&local_3f0);
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer(&local_3f0);
  TPZStepSolver<double>::SetGMRES
            (&local_230,(long)local_400,local_3fc,&local_130.super_TPZMatrixSolver<double>,
             (REAL)local_3d8._8_8_,0);
  local_410.fRef = (TPZReference *)0x0;
  local_410.fRef = (TPZReference *)operator_new(0x10);
  ((local_410.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
  (local_410.fRef)->fPointer = pTVar1;
  LOCK();
  ((local_410.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  TPZMatrixSolver<double>::SetMatrix(&local_230.super_TPZMatrixSolver<double>,&local_410);
  TPZAutoPointer<TPZBaseMatrix>::~TPZAutoPointer(&local_410);
  (*(this->super_TPZLinearAnalysis).super_TPZAnalysis.super_TPZSavable._vptr_TPZSavable[0x10])
            (this,&local_230);
  this->fHasFrontalPreconditioner = 0;
  TPZStepSolver<double>::~TPZStepSolver(&local_230);
  TPZStructMatrix::~TPZStructMatrix
            ((TPZStructMatrix *)local_2e8,&PTR_construction_vtable_104__01922b98);
  TPZStepSolver<double>::~TPZStepSolver(&local_130);
  local_2f8 = 0x1924d88;
  local_3c8._0_8_ = local_3d8._0_8_;
  local_3c8._160_8_ = 0x1924c88;
  local_320 = &PTR__TPZVec_01813ef0;
  if (local_318 != (void *)0x0) {
    operator_delete__(local_318);
  }
  TPZStructMatrix::~TPZStructMatrix((TPZStructMatrix *)local_3c8,local_3f8);
  return;
}

Assistant:

void TPZEulerAnalysis::SetGMResFront(REAL tol, int numiter, int numvectors)
{
	TPZFrontStructMatrix <TPZFrontNonSym<STATE> > strfront(Mesh());
	strfront.SetQuiet(1);
	auto *front = strfront.CreateAssemble(fRhs,NULL);
	
	TPZStepSolver<STATE> FrontSolver;
	FrontSolver.SetDirect(ELU);
	FrontSolver.SetMatrix(front);
	
	
	TPZSpStructMatrix<STATE> StrMatrix(Mesh());
	//TPZFStructMatrix<STATE> StrMatrix(cmesh);
	SetStructuralMatrix(StrMatrix);
	
	auto * mat = StrMatrix.Create();
	TPZStepSolver<STATE> Solver;
	Solver.SetGMRES(numiter,
					numvectors,
					FrontSolver,
					tol,
					0);
	Solver.SetMatrix(mat);
	SetSolver(Solver);
	fHasFrontalPreconditioner = 0;
	
}